

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeField
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  long lVar1;
  unsigned_long uVar2;
  bool bVar3;
  CppType CVar4;
  Type TVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  CppStringType CVar9;
  uint32_t uVar10;
  Reflection *this;
  MapFieldBase *this_00;
  reference pMVar11;
  MapKey *key;
  MapValueConstRef *value_17;
  Descriptor *pDVar12;
  MessageOptions *pMVar13;
  uint8_t *puVar14;
  RepeatedField<int> *pRVar15;
  const_pointer piVar16;
  RepeatedField<long> *pRVar17;
  size_t sVar18;
  const_pointer plVar19;
  RepeatedField<unsigned_int> *pRVar20;
  const_pointer puVar21;
  RepeatedField<unsigned_long> *pRVar22;
  const_pointer puVar23;
  byte *pbVar24;
  RepeatedField<float> *pRVar25;
  const_pointer data;
  RepeatedField<double> *pRVar26;
  const_pointer data_00;
  RepeatedField<bool> *rhs;
  const_pointer data_01;
  LogMessage *pLVar27;
  MessageLite *pMVar28;
  WireFormatLite *this_01;
  char *data_02;
  size_t sVar29;
  void *pvVar30;
  const_pointer piVar31;
  char *in_R9;
  string_view sVar32;
  string_view field_name;
  string *local_18a8;
  string *local_17e8;
  EnumValueDescriptor *local_17b8;
  bool local_175b;
  double local_1740;
  float local_1714;
  int64_t local_16f0;
  int32_t local_16c4;
  uint64_t local_16a0;
  uint32_t local_1674;
  uint64_t local_1650;
  uint32_t local_1624;
  int64_t local_1600;
  int32_t local_15d4;
  int64_t local_15b0;
  int32_t local_1584;
  string *value_15;
  string scratch_1;
  Cord value_16;
  string *value_14;
  string scratch;
  bool strict_utf8_check;
  EnumValueDescriptor *value_13;
  Message *msg_1;
  Message *msg;
  bool value_12;
  double value_11;
  float value_10;
  int64_t value_9;
  int32_t value_8;
  uint64_t value_7;
  uint32_t value_6;
  uint64_t value_5;
  uint32_t value_4;
  int64_t value_3;
  int32_t value_2;
  int64_t value_1;
  int32_t value;
  int j;
  anon_class_24_3_10f69874 get_message_from_field;
  Voidify local_e71;
  undefined1 local_e70 [8];
  RepeatedField<bool> r_13;
  RepeatedField<double> r_12;
  RepeatedField<float> r_11;
  RepeatedField<long> r_10;
  RepeatedField<int> r_9;
  RepeatedField<unsigned_long> r_8;
  RepeatedField<unsigned_int> r_7;
  RepeatedField<int> r_6;
  RepeatedField<unsigned_long> r_5;
  RepeatedField<unsigned_int> r_4;
  RepeatedField<long> r_3;
  RepeatedField<int> r_2;
  RepeatedField<long> r_1;
  RepeatedField<int> r;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  local_d88;
  undefined1 local_d70 [8];
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  map_entries;
  undefined1 local_d50 [4];
  int count;
  undefined1 local_d08 [8];
  MapIterator it_1;
  undefined1 local_cb0 [8];
  MapValueConstRef map_value;
  __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
  local_c98;
  iterator it;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  MapFieldBase *map_field;
  Reflection *message_reflection;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Message *message_local;
  FieldDescriptor *field_local;
  unsigned_long size;
  unsigned_long element_size;
  unsigned_long size_1;
  unsigned_long element_size_1;
  unsigned_long size_2;
  unsigned_long element_size_2;
  unsigned_long size_3;
  unsigned_long element_size_3;
  unsigned_long size_4;
  unsigned_long element_size_4;
  unsigned_long size_5;
  unsigned_long element_size_5;
  unsigned_long size_6;
  unsigned_long element_size_6;
  ptrdiff_t size_8;
  EpsCopyOutputStream *local_9a0;
  ptrdiff_t size_7;
  EpsCopyOutputStream *local_960;
  EpsCopyOutputStream *local_958;
  uint local_94c;
  EpsCopyOutputStream *local_948;
  uint local_93c;
  const_pointer end_6;
  const_pointer it_8;
  EpsCopyOutputStream *local_920;
  byte *local_8f8;
  ulong local_8f0;
  const_pointer end;
  const_pointer it_2;
  EpsCopyOutputStream *local_8d0;
  byte *local_8a8;
  ulong local_8a0;
  LogMessage local_868;
  Voidify local_851;
  byte *local_850;
  undefined4 local_848;
  int local_844;
  EpsCopyOutputStream *local_840;
  byte *local_838;
  uint local_82c;
  byte *local_828;
  uint local_820;
  int local_81c;
  EpsCopyOutputStream *local_818;
  byte local_7f9;
  LogMessage local_7f8;
  Voidify local_7e1;
  byte *local_7e0;
  uint local_7d8;
  int local_7d4;
  EpsCopyOutputStream *local_7d0;
  byte *local_7c8;
  uint local_7bc;
  byte *local_7b8;
  uint local_7b0;
  int local_7ac;
  EpsCopyOutputStream *local_7a8;
  byte local_789;
  LogMessage local_788;
  Voidify local_771;
  byte *local_770;
  uint local_768;
  int local_764;
  EpsCopyOutputStream *local_760;
  byte *local_758;
  uint local_74c;
  byte *local_748;
  uint local_740;
  int local_73c;
  EpsCopyOutputStream *local_738;
  byte local_719;
  LogMessage local_718;
  Voidify local_701;
  byte *local_700;
  uint local_6f8;
  int local_6f4;
  EpsCopyOutputStream *local_6f0;
  byte *local_6e8;
  uint local_6dc;
  byte *local_6d8;
  uint local_6d0;
  int local_6cc;
  EpsCopyOutputStream *local_6c8;
  byte local_6a9;
  LogMessage local_6a8;
  Voidify local_691;
  byte *local_690;
  uint local_688;
  int local_684;
  EpsCopyOutputStream *local_680;
  byte *local_678;
  uint local_66c;
  byte *local_668;
  uint local_660;
  int local_65c;
  EpsCopyOutputStream *local_658;
  byte local_639;
  LogMessage local_638;
  Voidify local_621;
  byte *local_620;
  uint local_618;
  int local_614;
  EpsCopyOutputStream *local_610;
  byte *local_608;
  uint local_5fc;
  byte *local_5f8;
  uint local_5f0;
  int local_5ec;
  EpsCopyOutputStream *local_5e8;
  byte local_5c9;
  LogMessage local_5c8;
  Voidify local_5b1;
  byte *local_5b0;
  uint local_5a8;
  int local_5a4;
  EpsCopyOutputStream *local_5a0;
  byte *local_598;
  uint local_58c;
  byte *local_588;
  uint local_580;
  int local_57c;
  EpsCopyOutputStream *local_578;
  byte local_559;
  LogMessage local_558;
  Voidify local_541;
  byte *local_540;
  uint local_538;
  int local_534;
  EpsCopyOutputStream *local_530;
  byte *local_528;
  uint local_51c;
  byte *local_518;
  uint local_510;
  int local_50c;
  EpsCopyOutputStream *local_508;
  byte local_4e9;
  LogMessage local_4e8;
  Voidify local_4d1;
  byte *local_4d0;
  uint local_4c8;
  int local_4c4;
  EpsCopyOutputStream *local_4c0;
  byte *local_4b8;
  uint local_4ac;
  byte *local_4a8;
  uint local_49c;
  byte *local_498;
  uint local_48c;
  byte *local_488;
  uint local_47c;
  byte *local_478;
  uint local_46c;
  byte *local_468;
  uint local_45c;
  byte *local_458;
  uint local_44c;
  byte *local_448;
  uint local_43c;
  EpsCopyOutputStream *local_438;
  uint local_42c;
  EpsCopyOutputStream *local_428;
  uint local_41c;
  const_pointer local_418;
  const_pointer end_1;
  const_pointer it_3;
  EpsCopyOutputStream *local_400;
  uint local_3f4;
  RepeatedField<long> *local_3f0;
  int local_3e4;
  EpsCopyOutputStream *local_3e0;
  EpsCopyOutputStream *local_3d8;
  ulong local_3d0;
  byte *local_3c8;
  uint local_3c0;
  int local_3bc;
  EpsCopyOutputStream *local_3b8;
  byte local_399;
  LogMessage local_398;
  Voidify local_381;
  byte *local_380;
  uint local_378;
  int local_374;
  EpsCopyOutputStream *local_370;
  byte *local_368;
  uint local_35c;
  EpsCopyOutputStream *local_358;
  uint local_34c;
  const_pointer local_348;
  const_pointer end_2;
  const_pointer it_4;
  EpsCopyOutputStream *local_330;
  uint local_324;
  RepeatedField<int> *local_320;
  int local_314;
  EpsCopyOutputStream *local_310;
  EpsCopyOutputStream *local_308;
  uint local_2fc;
  byte *local_2f8;
  uint local_2f0;
  int local_2ec;
  EpsCopyOutputStream *local_2e8;
  byte local_2c9;
  LogMessage local_2c8;
  Voidify local_2b1;
  byte *local_2b0;
  uint local_2a8;
  int local_2a4;
  EpsCopyOutputStream *local_2a0;
  byte *local_298;
  uint local_28c;
  EpsCopyOutputStream *local_288;
  uint local_27c;
  const_pointer local_278;
  const_pointer end_3;
  const_pointer it_5;
  EpsCopyOutputStream *local_260;
  uint local_254;
  RepeatedField<long> *local_250;
  int local_244;
  EpsCopyOutputStream *local_240;
  EpsCopyOutputStream *local_238;
  ulong local_230;
  byte *local_228;
  uint local_220;
  int local_21c;
  EpsCopyOutputStream *local_218;
  byte local_1f9;
  LogMessage local_1f8;
  Voidify local_1e1;
  byte *local_1e0;
  uint local_1d8;
  int local_1d4;
  EpsCopyOutputStream *local_1d0;
  byte *local_1c8;
  uint local_1bc;
  EpsCopyOutputStream *local_1b8;
  uint local_1ac;
  const_pointer local_1a8;
  const_pointer end_4;
  const_pointer it_6;
  EpsCopyOutputStream *local_190;
  uint local_184;
  RepeatedField<unsigned_int> *local_180;
  int local_174;
  EpsCopyOutputStream *local_170;
  EpsCopyOutputStream *local_168;
  uint local_15c;
  byte *local_158;
  uint local_150;
  int local_14c;
  EpsCopyOutputStream *local_148;
  byte local_129;
  LogMessage local_128;
  Voidify local_111;
  byte *local_110;
  uint local_108;
  int local_104;
  EpsCopyOutputStream *local_100;
  byte *local_f8;
  uint local_ec;
  EpsCopyOutputStream *local_e8;
  uint local_dc;
  const_pointer local_d8;
  const_pointer end_5;
  const_pointer it_7;
  EpsCopyOutputStream *local_c0;
  uint local_b4;
  RepeatedField<unsigned_long> *local_b0;
  int local_a4;
  EpsCopyOutputStream *local_a0;
  EpsCopyOutputStream *local_98;
  ulong local_90;
  byte *local_88;
  uint local_80;
  int local_7c;
  EpsCopyOutputStream *local_78;
  byte local_59;
  LogMessage local_58;
  Voidify local_41;
  byte *local_40;
  uint local_38;
  int local_34;
  EpsCopyOutputStream *local_30;
  byte *local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  this = Message::GetReflection(message);
  bVar3 = FieldDescriptor::is_extension(field);
  if (bVar3) {
    pDVar12 = FieldDescriptor::containing_type(field);
    pMVar13 = Descriptor::options(pDVar12);
    bVar3 = MessageOptions::message_set_wire_format(pMVar13);
    if (((bVar3) && (CVar4 = FieldDescriptor::cpp_type(field), CVar4 == CPPTYPE_MESSAGE)) &&
       (bVar3 = FieldDescriptor::is_repeated(field), !bVar3)) {
      puVar14 = InternalSerializeMessageSetItem(field,message,target,stream);
      return puVar14;
    }
  }
  bVar3 = FieldDescriptor::is_map(field);
  stream_local = (EpsCopyOutputStream *)target;
  if (bVar3) {
    this_00 = Reflection::GetMapData(this,message,field);
    bVar3 = MapFieldBase::IsMapValid(this_00);
    if (bVar3) {
      bVar3 = protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
      if (bVar3) {
        MapKeySorter::SortKey
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   &it,message,this,field);
        local_c98._M_current =
             (MapKey *)
             std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::begin
                       ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                         *)&it);
        while( true ) {
          map_value._8_8_ =
               std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::end
                         ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                           *)&it);
          bVar3 = __gnu_cxx::operator!=
                            (&local_c98,
                             (__normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
                              *)&map_value.type_);
          if (!bVar3) break;
          MapValueConstRef::MapValueConstRef((MapValueConstRef *)local_cb0);
          pMVar11 = __gnu_cxx::
                    __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
                    ::operator*(&local_c98);
          Reflection::LookupMapValue(this,message,field,pMVar11,(MapValueConstRef *)local_cb0);
          pMVar11 = __gnu_cxx::
                    __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
                    ::operator*(&local_c98);
          stream_local = (EpsCopyOutputStream *)
                         InternalSerializeMapEntry
                                   (field,pMVar11,(MapValueConstRef *)local_cb0,
                                    (uint8_t *)stream_local,stream);
          __gnu_cxx::
          __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
          ::operator++(&local_c98);
        }
        std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::~vector
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   &it);
      }
      else {
        Reflection::MapBegin((MapIterator *)local_d08,this,message,field);
        while( true ) {
          Reflection::MapEnd((MapIterator *)local_d50,this,message,field);
          bVar3 = protobuf::operator!=((MapIterator *)local_d08,(MapIterator *)local_d50);
          if (!bVar3) break;
          key = MapIterator::GetKey((MapIterator *)local_d08);
          value_17 = &MapIterator::GetValueRef((MapIterator *)local_d08)->super_MapValueConstRef;
          stream_local = (EpsCopyOutputStream *)
                         InternalSerializeMapEntry
                                   (field,key,value_17,(uint8_t *)stream_local,stream);
          MapIterator::operator++((MapIterator *)local_d08);
        }
      }
      return (uint8_t *)stream_local;
    }
  }
  map_entries.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  bVar3 = FieldDescriptor::is_repeated(field);
  if (bVar3) {
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         Reflection::FieldSize(this,message,field);
  }
  else {
    pDVar12 = FieldDescriptor::containing_type(field);
    pMVar13 = Descriptor::options(pDVar12);
    bVar3 = MessageOptions::map_entry(pMVar13);
    if (bVar3) {
      map_entries.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      bVar3 = Reflection::HasField(this,message,field);
      if (bVar3) {
        map_entries.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
    }
  }
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            *)local_d70);
  if (((1 < map_entries.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) &&
      (bVar3 = FieldDescriptor::is_map(field), bVar3)) &&
     (bVar3 = protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream), bVar3)) {
    DynamicMapSorter::Sort
              (&local_d88,message,
               map_entries.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,this,field);
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    operator=((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *)local_d70,&local_d88);
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    ~vector(&local_d88);
  }
  bVar3 = FieldDescriptor::is_packed(field);
  if (bVar3) {
    field_local = (FieldDescriptor *)target;
    if (map_entries.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      puVar14 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      TVar5 = FieldDescriptor::type(field);
      switch(TVar5) {
      case TYPE_DOUBLE:
        pRVar26 = Reflection::GetRepeatedFieldInternal<double>(this,message,field);
        RepeatedField<double>::RepeatedField
                  ((RepeatedField<double> *)((long)&r_13.soo_rep_.field_0 + 8),pRVar26);
        iVar6 = FieldDescriptor::number(field);
        pRVar26 = (RepeatedField<double> *)((long)&r_13.soo_rep_.field_0 + 8);
        pbVar24 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        iVar7 = RepeatedField<double>::size(pRVar26);
        uVar8 = iVar7 << 3;
        local_6f8 = 2;
        local_719 = 0;
        local_748 = pbVar24;
        local_740 = uVar8;
        local_73c = iVar6;
        local_738 = stream;
        local_700 = pbVar24;
        local_6f4 = iVar6;
        local_6f0 = stream;
        if (stream->end_ <= pbVar24) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_718,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_719 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_718);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_701,pLVar27);
        }
        if ((local_719 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_718);
        }
        local_6e8 = local_700;
        for (local_6dc = local_6f4 << 3 | local_6f8; 0x7f < local_6dc; local_6dc = local_6dc >> 7) {
          *local_6e8 = (byte)local_6dc | 0x80;
          local_6e8 = local_6e8 + 1;
        }
        local_748 = local_6e8 + 1;
        *local_6e8 = (byte)local_6dc;
        local_458 = local_748;
        for (local_44c = local_740; 0x7f < local_44c; local_44c = local_44c >> 7) {
          *local_458 = (byte)local_44c | 0x80;
          local_458 = local_458 + 1;
        }
        pbVar24 = local_458 + 1;
        *local_458 = (byte)local_44c;
        local_6e8 = local_748;
        local_458 = pbVar24;
        data_00 = RepeatedField<double>::data(pRVar26);
        stream_local = (EpsCopyOutputStream *)
                       protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                                 (stream,data_00,uVar8,pbVar24);
        RepeatedField<double>::~RepeatedField
                  ((RepeatedField<double> *)((long)&r_13.soo_rep_.field_0 + 8));
        break;
      case TYPE_FLOAT:
        pRVar25 = Reflection::GetRepeatedFieldInternal<float>(this,message,field);
        RepeatedField<float>::RepeatedField
                  ((RepeatedField<float> *)((long)&r_12.soo_rep_.field_0 + 8),pRVar25);
        iVar6 = FieldDescriptor::number(field);
        pRVar25 = (RepeatedField<float> *)((long)&r_12.soo_rep_.field_0 + 8);
        pbVar24 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        iVar7 = RepeatedField<float>::size(pRVar25);
        uVar8 = iVar7 << 2;
        local_688 = 2;
        local_6a9 = 0;
        local_6d8 = pbVar24;
        local_6d0 = uVar8;
        local_6cc = iVar6;
        local_6c8 = stream;
        local_690 = pbVar24;
        local_684 = iVar6;
        local_680 = stream;
        if (stream->end_ <= pbVar24) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_6a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_6a9 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_6a8);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_691,pLVar27);
        }
        if ((local_6a9 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_6a8);
        }
        local_678 = local_690;
        for (local_66c = local_684 << 3 | local_688; 0x7f < local_66c; local_66c = local_66c >> 7) {
          *local_678 = (byte)local_66c | 0x80;
          local_678 = local_678 + 1;
        }
        local_6d8 = local_678 + 1;
        *local_678 = (byte)local_66c;
        local_468 = local_6d8;
        for (local_45c = local_6d0; 0x7f < local_45c; local_45c = local_45c >> 7) {
          *local_468 = (byte)local_45c | 0x80;
          local_468 = local_468 + 1;
        }
        pbVar24 = local_468 + 1;
        *local_468 = (byte)local_45c;
        local_678 = local_6d8;
        local_468 = pbVar24;
        data = RepeatedField<float>::data(pRVar25);
        stream_local = (EpsCopyOutputStream *)
                       protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                                 (stream,data,uVar8,pbVar24);
        RepeatedField<float>::~RepeatedField
                  ((RepeatedField<float> *)((long)&r_12.soo_rep_.field_0 + 8));
        break;
      case TYPE_INT64:
        pRVar17 = Reflection::GetRepeatedFieldInternal<long>(this,message,field);
        RepeatedField<long>::RepeatedField
                  ((RepeatedField<long> *)((long)&r_2.soo_rep_.field_0 + 8),pRVar17);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        local_3f0 = (RepeatedField<long> *)((long)&r_2.soo_rep_.field_0 + 8);
        local_3f4 = (uint)sVar18;
        it_3 = (const_pointer)protobuf::io::EpsCopyOutputStream::Encode64;
        local_400 = (EpsCopyOutputStream *)puVar14;
        local_3e4 = iVar6;
        local_3e0 = stream;
        local_400 = (EpsCopyOutputStream *)
                    protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_3bc = local_3e4;
        local_3c0 = local_3f4;
        local_374 = local_3e4;
        local_378 = 2;
        local_399 = 0;
        local_3c8 = (byte *)local_400;
        local_3b8 = stream;
        local_380 = (byte *)local_400;
        local_370 = stream;
        if (stream->end_ <= local_400) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_398,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_399 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_398);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_381,pLVar27);
        }
        if ((local_399 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_398);
        }
        local_368 = local_380;
        for (local_35c = local_374 << 3 | local_378; 0x7f < local_35c; local_35c = local_35c >> 7) {
          *local_368 = (byte)local_35c | 0x80;
          local_368 = local_368 + 1;
        }
        local_3c8 = local_368 + 1;
        *local_368 = (byte)local_35c;
        local_358 = (EpsCopyOutputStream *)local_3c8;
        for (local_34c = local_3c0; 0x7f < local_34c; local_34c = local_34c >> 7) {
          *(byte *)local_358 = (byte)local_34c | 0x80;
          local_358 = (EpsCopyOutputStream *)((long)local_358 + 1);
        }
        local_400 = (EpsCopyOutputStream *)((long)local_358 + 1);
        *(byte *)local_358 = (byte)local_34c;
        local_368 = local_3c8;
        local_358 = local_400;
        plVar19 = RepeatedField<long>::data(local_3f0);
        end_1 = plVar19;
        iVar6 = RepeatedField<long>::size(local_3f0);
        local_418 = plVar19 + iVar6;
        do {
          local_400 = (EpsCopyOutputStream *)
                      protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_400);
          lVar1 = *end_1;
          end_1 = end_1 + 1;
          local_3d0 = (*(code *)it_3)(lVar1);
          local_3d8 = local_400;
          for (; 0x7f < local_3d0; local_3d0 = local_3d0 >> 7) {
            *(byte *)local_3d8 = (byte)local_3d0 | 0x80;
            local_3d8 = (EpsCopyOutputStream *)((long)local_3d8 + 1);
          }
          stream_local = (EpsCopyOutputStream *)((long)local_3d8 + 1);
          *(byte *)local_3d8 = (byte)local_3d0;
          local_400 = stream_local;
          local_3d8 = stream_local;
        } while (end_1 < local_418);
        RepeatedField<long>::~RepeatedField
                  ((RepeatedField<long> *)((long)&r_2.soo_rep_.field_0 + 8));
        break;
      case TYPE_UINT64:
        pRVar22 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this,message,field);
        RepeatedField<unsigned_long>::RepeatedField
                  ((RepeatedField<unsigned_long> *)((long)&r_6.soo_rep_.field_0 + 8),pRVar22);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        local_b0 = (RepeatedField<unsigned_long> *)((long)&r_6.soo_rep_.field_0 + 8);
        local_b4 = (uint)sVar18;
        it_7 = (const_pointer)protobuf::io::EpsCopyOutputStream::Encode64;
        local_c0 = (EpsCopyOutputStream *)puVar14;
        local_a4 = iVar6;
        local_a0 = stream;
        local_c0 = (EpsCopyOutputStream *)
                   protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_7c = local_a4;
        local_80 = local_b4;
        local_34 = local_a4;
        local_38 = 2;
        local_59 = 0;
        local_88 = (byte *)local_c0;
        local_78 = stream;
        local_40 = (byte *)local_c0;
        local_30 = stream;
        if (stream->end_ <= local_c0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_58,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_59 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar27);
        }
        if ((local_59 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_58);
        }
        local_28 = local_40;
        for (local_1c = local_34 << 3 | local_38; 0x7f < local_1c; local_1c = local_1c >> 7) {
          *local_28 = (byte)local_1c | 0x80;
          local_28 = local_28 + 1;
        }
        local_88 = local_28 + 1;
        *local_28 = (byte)local_1c;
        local_18 = (EpsCopyOutputStream *)local_88;
        for (local_c = local_80; 0x7f < local_c; local_c = local_c >> 7) {
          *(byte *)local_18 = (byte)local_c | 0x80;
          local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
        }
        local_c0 = (EpsCopyOutputStream *)((long)local_18 + 1);
        *(byte *)local_18 = (byte)local_c;
        local_28 = local_88;
        local_18 = local_c0;
        puVar23 = RepeatedField<unsigned_long>::data(local_b0);
        end_5 = puVar23;
        iVar6 = RepeatedField<unsigned_long>::size(local_b0);
        local_d8 = puVar23 + iVar6;
        do {
          local_c0 = (EpsCopyOutputStream *)
                     protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_c0);
          uVar2 = *end_5;
          end_5 = end_5 + 1;
          local_90 = (*(code *)it_7)(uVar2);
          local_98 = local_c0;
          for (; 0x7f < local_90; local_90 = local_90 >> 7) {
            *(byte *)local_98 = (byte)local_90 | 0x80;
            local_98 = (EpsCopyOutputStream *)((long)local_98 + 1);
          }
          stream_local = (EpsCopyOutputStream *)((long)local_98 + 1);
          *(byte *)local_98 = (byte)local_90;
          local_c0 = stream_local;
          local_98 = stream_local;
        } while (end_5 < local_d8);
        RepeatedField<unsigned_long>::~RepeatedField
                  ((RepeatedField<unsigned_long> *)((long)&r_6.soo_rep_.field_0 + 8));
        break;
      case TYPE_INT32:
        pRVar15 = Reflection::GetRepeatedFieldInternal<int>(this,message,field);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)((long)&r_1.soo_rep_.field_0 + 8),pRVar15);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        pRVar15 = (RepeatedField<int> *)((long)&r_1.soo_rep_.field_0 + 8);
        local_850 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_848 = 2;
        local_844 = iVar6;
        local_840 = stream;
        if (stream->end_ <= local_850) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_868,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_868);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_851,pLVar27);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_868);
        }
        local_838 = local_850;
        for (local_82c = iVar6 << 3 | 2; 0x7f < local_82c; local_82c = local_82c >> 7) {
          *local_838 = (byte)local_82c | 0x80;
          local_838 = local_838 + 1;
        }
        *local_838 = (byte)local_82c;
        local_428 = (EpsCopyOutputStream *)(local_838 + 1);
        for (local_41c = (uint)sVar18; 0x7f < local_41c; local_41c = local_41c >> 7) {
          *(byte *)local_428 = (byte)local_41c | 0x80;
          local_428 = (EpsCopyOutputStream *)((long)local_428 + 1);
        }
        local_8d0 = (EpsCopyOutputStream *)((long)local_428 + 1);
        *(byte *)local_428 = (byte)local_41c;
        local_838 = local_838 + 1;
        local_428 = local_8d0;
        piVar16 = RepeatedField<int>::data(pRVar15);
        iVar6 = RepeatedField<int>::size(pRVar15);
        end = piVar16;
        do {
          local_8a8 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_8d0);
          piVar31 = end + 1;
          for (local_8a0 = protobuf::io::EpsCopyOutputStream::Encode64((long)*end); 0x7f < local_8a0
              ; local_8a0 = local_8a0 >> 7) {
            *local_8a8 = (byte)local_8a0 | 0x80;
            local_8a8 = local_8a8 + 1;
          }
          stream_local = (EpsCopyOutputStream *)(local_8a8 + 1);
          *local_8a8 = (byte)local_8a0;
          end = piVar31;
          local_8d0 = stream_local;
        } while (piVar31 < piVar16 + iVar6);
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)((long)&r_1.soo_rep_.field_0 + 8));
        break;
      case TYPE_FIXED64:
        pRVar22 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this,message,field);
        RepeatedField<unsigned_long>::RepeatedField
                  ((RepeatedField<unsigned_long> *)((long)&r_9.soo_rep_.field_0 + 8),pRVar22);
        iVar6 = FieldDescriptor::number(field);
        pRVar22 = (RepeatedField<unsigned_long> *)((long)&r_9.soo_rep_.field_0 + 8);
        pbVar24 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        iVar7 = RepeatedField<unsigned_long>::size(pRVar22);
        uVar8 = iVar7 << 3;
        local_538 = 2;
        local_559 = 0;
        local_588 = pbVar24;
        local_580 = uVar8;
        local_57c = iVar6;
        local_578 = stream;
        local_540 = pbVar24;
        local_534 = iVar6;
        local_530 = stream;
        if (stream->end_ <= pbVar24) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_558,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_559 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_558);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_541,pLVar27);
        }
        if ((local_559 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_558);
        }
        local_528 = local_540;
        for (local_51c = local_534 << 3 | local_538; 0x7f < local_51c; local_51c = local_51c >> 7) {
          *local_528 = (byte)local_51c | 0x80;
          local_528 = local_528 + 1;
        }
        local_588 = local_528 + 1;
        *local_528 = (byte)local_51c;
        local_498 = local_588;
        for (local_48c = local_580; 0x7f < local_48c; local_48c = local_48c >> 7) {
          *local_498 = (byte)local_48c | 0x80;
          local_498 = local_498 + 1;
        }
        pbVar24 = local_498 + 1;
        *local_498 = (byte)local_48c;
        local_528 = local_588;
        local_498 = pbVar24;
        puVar23 = RepeatedField<unsigned_long>::data(pRVar22);
        stream_local = (EpsCopyOutputStream *)
                       protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                                 (stream,puVar23,uVar8,pbVar24);
        RepeatedField<unsigned_long>::~RepeatedField
                  ((RepeatedField<unsigned_long> *)((long)&r_9.soo_rep_.field_0 + 8));
        break;
      case TYPE_FIXED32:
        pRVar20 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this,message,field);
        RepeatedField<unsigned_int>::RepeatedField
                  ((RepeatedField<unsigned_int> *)((long)&r_8.soo_rep_.field_0 + 8),pRVar20);
        iVar6 = FieldDescriptor::number(field);
        pRVar20 = (RepeatedField<unsigned_int> *)((long)&r_8.soo_rep_.field_0 + 8);
        pbVar24 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        iVar7 = RepeatedField<unsigned_int>::size(pRVar20);
        uVar8 = iVar7 << 2;
        local_4c8 = 2;
        local_4e9 = 0;
        local_518 = pbVar24;
        local_510 = uVar8;
        local_50c = iVar6;
        local_508 = stream;
        local_4d0 = pbVar24;
        local_4c4 = iVar6;
        local_4c0 = stream;
        if (stream->end_ <= pbVar24) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_4e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_4e9 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_4e8);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_4d1,pLVar27);
        }
        if ((local_4e9 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_4e8);
        }
        local_4b8 = local_4d0;
        for (local_4ac = local_4c4 << 3 | local_4c8; 0x7f < local_4ac; local_4ac = local_4ac >> 7) {
          *local_4b8 = (byte)local_4ac | 0x80;
          local_4b8 = local_4b8 + 1;
        }
        local_518 = local_4b8 + 1;
        *local_4b8 = (byte)local_4ac;
        local_4a8 = local_518;
        for (local_49c = local_510; 0x7f < local_49c; local_49c = local_49c >> 7) {
          *local_4a8 = (byte)local_49c | 0x80;
          local_4a8 = local_4a8 + 1;
        }
        pbVar24 = local_4a8 + 1;
        *local_4a8 = (byte)local_49c;
        local_4b8 = local_518;
        local_4a8 = pbVar24;
        puVar21 = RepeatedField<unsigned_int>::data(pRVar20);
        stream_local = (EpsCopyOutputStream *)
                       protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                                 (stream,puVar21,uVar8,pbVar24);
        RepeatedField<unsigned_int>::~RepeatedField
                  ((RepeatedField<unsigned_int> *)((long)&r_8.soo_rep_.field_0 + 8));
        break;
      case TYPE_BOOL:
        rhs = Reflection::GetRepeatedFieldInternal<bool>(this,message,field);
        RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)local_e70,rhs);
        iVar6 = FieldDescriptor::number(field);
        pbVar24 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        uVar8 = RepeatedField<bool>::size((RepeatedField<bool> *)local_e70);
        local_768 = 2;
        local_789 = 0;
        local_7b8 = pbVar24;
        local_7b0 = uVar8;
        local_7ac = iVar6;
        local_7a8 = stream;
        local_770 = pbVar24;
        local_764 = iVar6;
        local_760 = stream;
        if (stream->end_ <= pbVar24) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_788,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_789 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_788);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_771,pLVar27);
        }
        if ((local_789 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_788);
        }
        local_758 = local_770;
        for (local_74c = local_764 << 3 | local_768; 0x7f < local_74c; local_74c = local_74c >> 7) {
          *local_758 = (byte)local_74c | 0x80;
          local_758 = local_758 + 1;
        }
        local_7b8 = local_758 + 1;
        *local_758 = (byte)local_74c;
        local_448 = local_7b8;
        for (local_43c = local_7b0; 0x7f < local_43c; local_43c = local_43c >> 7) {
          *local_448 = (byte)local_43c | 0x80;
          local_448 = local_448 + 1;
        }
        pbVar24 = local_448 + 1;
        *local_448 = (byte)local_43c;
        local_758 = local_7b8;
        local_448 = pbVar24;
        data_01 = RepeatedField<bool>::data((RepeatedField<bool> *)local_e70);
        stream_local = (EpsCopyOutputStream *)
                       protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<1>
                                 (stream,data_01,uVar8,pbVar24);
        RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)local_e70);
        break;
      default:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&get_message_from_field.message_reflection,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
                   ,0x522);
        pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)&get_message_from_field.message_reflection);
        pLVar27 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar27,(char (*) [19])"Invalid descriptor");
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_e71,pLVar27);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&get_message_from_field.message_reflection);
      case TYPE_UINT32:
        pRVar20 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this,message,field);
        RepeatedField<unsigned_int>::RepeatedField
                  ((RepeatedField<unsigned_int> *)((long)&r_5.soo_rep_.field_0 + 8),pRVar20);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        local_180 = (RepeatedField<unsigned_int> *)((long)&r_5.soo_rep_.field_0 + 8);
        local_184 = (uint)sVar18;
        it_6 = (const_pointer)protobuf::io::EpsCopyOutputStream::Encode32;
        local_190 = (EpsCopyOutputStream *)puVar14;
        local_174 = iVar6;
        local_170 = stream;
        local_190 = (EpsCopyOutputStream *)
                    protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_14c = local_174;
        local_150 = local_184;
        local_104 = local_174;
        local_108 = 2;
        local_129 = 0;
        local_158 = (byte *)local_190;
        local_148 = stream;
        local_110 = (byte *)local_190;
        local_100 = stream;
        if (stream->end_ <= local_190) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_128,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_129 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_128);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_111,pLVar27);
        }
        if ((local_129 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_128);
        }
        local_f8 = local_110;
        for (local_ec = local_104 << 3 | local_108; 0x7f < local_ec; local_ec = local_ec >> 7) {
          *local_f8 = (byte)local_ec | 0x80;
          local_f8 = local_f8 + 1;
        }
        local_158 = local_f8 + 1;
        *local_f8 = (byte)local_ec;
        local_e8 = (EpsCopyOutputStream *)local_158;
        for (local_dc = local_150; 0x7f < local_dc; local_dc = local_dc >> 7) {
          *(byte *)local_e8 = (byte)local_dc | 0x80;
          local_e8 = (EpsCopyOutputStream *)((long)local_e8 + 1);
        }
        local_190 = (EpsCopyOutputStream *)((long)local_e8 + 1);
        *(byte *)local_e8 = (byte)local_dc;
        local_f8 = local_158;
        local_e8 = local_190;
        puVar21 = RepeatedField<unsigned_int>::data(local_180);
        end_4 = puVar21;
        iVar6 = RepeatedField<unsigned_int>::size(local_180);
        local_1a8 = puVar21 + iVar6;
        do {
          local_190 = (EpsCopyOutputStream *)
                      protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_190);
          uVar8 = *end_4;
          end_4 = end_4 + 1;
          local_15c = (*(code *)it_6)(uVar8);
          local_168 = local_190;
          for (; 0x7f < local_15c; local_15c = local_15c >> 7) {
            *(byte *)local_168 = (byte)local_15c | 0x80;
            local_168 = (EpsCopyOutputStream *)((long)local_168 + 1);
          }
          stream_local = (EpsCopyOutputStream *)((long)local_168 + 1);
          *(byte *)local_168 = (byte)local_15c;
          local_190 = stream_local;
          local_168 = stream_local;
        } while (end_4 < local_1a8);
        RepeatedField<unsigned_int>::~RepeatedField
                  ((RepeatedField<unsigned_int> *)((long)&r_5.soo_rep_.field_0 + 8));
        break;
      case TYPE_ENUM:
        pRVar15 = Reflection::GetRepeatedFieldInternal<int>(this,message,field);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)((long)&r_7.soo_rep_.field_0 + 8),pRVar15);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        pRVar15 = (RepeatedField<int> *)((long)&r_7.soo_rep_.field_0 + 8);
        local_828 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_7d8 = 2;
        local_7f9 = 0;
        local_820 = (uint)sVar18;
        local_81c = iVar6;
        local_818 = stream;
        local_7e0 = local_828;
        local_7d4 = iVar6;
        local_7d0 = stream;
        if (stream->end_ <= local_828) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_7f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_7f9 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_7f8);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_7e1,pLVar27);
        }
        if ((local_7f9 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_7f8);
        }
        local_7c8 = local_7e0;
        for (local_7bc = local_7d4 << 3 | local_7d8; 0x7f < local_7bc; local_7bc = local_7bc >> 7) {
          *local_7c8 = (byte)local_7bc | 0x80;
          local_7c8 = local_7c8 + 1;
        }
        local_828 = local_7c8 + 1;
        *local_7c8 = (byte)local_7bc;
        local_438 = (EpsCopyOutputStream *)local_828;
        for (local_42c = local_820; 0x7f < local_42c; local_42c = local_42c >> 7) {
          *(byte *)local_438 = (byte)local_42c | 0x80;
          local_438 = (EpsCopyOutputStream *)((long)local_438 + 1);
        }
        local_920 = (EpsCopyOutputStream *)((long)local_438 + 1);
        *(byte *)local_438 = (byte)local_42c;
        local_7c8 = local_828;
        local_438 = local_920;
        piVar16 = RepeatedField<int>::data(pRVar15);
        iVar6 = RepeatedField<int>::size(pRVar15);
        end_6 = piVar16;
        do {
          local_8f8 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_920);
          piVar31 = end_6 + 1;
          for (local_8f0 = protobuf::io::EpsCopyOutputStream::Encode64((long)*end_6);
              0x7f < local_8f0; local_8f0 = local_8f0 >> 7) {
            *local_8f8 = (byte)local_8f0 | 0x80;
            local_8f8 = local_8f8 + 1;
          }
          stream_local = (EpsCopyOutputStream *)(local_8f8 + 1);
          *local_8f8 = (byte)local_8f0;
          end_6 = piVar31;
          local_920 = stream_local;
        } while (piVar31 < piVar16 + iVar6);
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)((long)&r_7.soo_rep_.field_0 + 8));
        break;
      case TYPE_SFIXED32:
        pRVar15 = Reflection::GetRepeatedFieldInternal<int>(this,message,field);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)((long)&r_10.soo_rep_.field_0 + 8),pRVar15);
        iVar6 = FieldDescriptor::number(field);
        pRVar15 = (RepeatedField<int> *)((long)&r_10.soo_rep_.field_0 + 8);
        pbVar24 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        iVar7 = RepeatedField<int>::size(pRVar15);
        uVar8 = iVar7 << 2;
        local_5a8 = 2;
        local_5c9 = 0;
        local_5f8 = pbVar24;
        local_5f0 = uVar8;
        local_5ec = iVar6;
        local_5e8 = stream;
        local_5b0 = pbVar24;
        local_5a4 = iVar6;
        local_5a0 = stream;
        if (stream->end_ <= pbVar24) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_5c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_5c9 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_5c8);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_5b1,pLVar27);
        }
        if ((local_5c9 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_5c8);
        }
        local_598 = local_5b0;
        for (local_58c = local_5a4 << 3 | local_5a8; 0x7f < local_58c; local_58c = local_58c >> 7) {
          *local_598 = (byte)local_58c | 0x80;
          local_598 = local_598 + 1;
        }
        local_5f8 = local_598 + 1;
        *local_598 = (byte)local_58c;
        local_488 = local_5f8;
        for (local_47c = local_5f0; 0x7f < local_47c; local_47c = local_47c >> 7) {
          *local_488 = (byte)local_47c | 0x80;
          local_488 = local_488 + 1;
        }
        pbVar24 = local_488 + 1;
        *local_488 = (byte)local_47c;
        local_598 = local_5f8;
        local_488 = pbVar24;
        piVar16 = RepeatedField<int>::data(pRVar15);
        stream_local = (EpsCopyOutputStream *)
                       protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                                 (stream,piVar16,uVar8,pbVar24);
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)((long)&r_10.soo_rep_.field_0 + 8))
        ;
        break;
      case TYPE_SFIXED64:
        pRVar17 = Reflection::GetRepeatedFieldInternal<long>(this,message,field);
        RepeatedField<long>::RepeatedField
                  ((RepeatedField<long> *)((long)&r_11.soo_rep_.field_0 + 8),pRVar17);
        iVar6 = FieldDescriptor::number(field);
        pRVar17 = (RepeatedField<long> *)((long)&r_11.soo_rep_.field_0 + 8);
        pbVar24 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        iVar7 = RepeatedField<long>::size(pRVar17);
        uVar8 = iVar7 << 3;
        local_618 = 2;
        local_639 = 0;
        local_668 = pbVar24;
        local_660 = uVar8;
        local_65c = iVar6;
        local_658 = stream;
        local_620 = pbVar24;
        local_614 = iVar6;
        local_610 = stream;
        if (stream->end_ <= pbVar24) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_638,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_639 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_638);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_621,pLVar27);
        }
        if ((local_639 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_638);
        }
        local_608 = local_620;
        for (local_5fc = local_614 << 3 | local_618; 0x7f < local_5fc; local_5fc = local_5fc >> 7) {
          *local_608 = (byte)local_5fc | 0x80;
          local_608 = local_608 + 1;
        }
        local_668 = local_608 + 1;
        *local_608 = (byte)local_5fc;
        local_478 = local_668;
        for (local_46c = local_660; 0x7f < local_46c; local_46c = local_46c >> 7) {
          *local_478 = (byte)local_46c | 0x80;
          local_478 = local_478 + 1;
        }
        pbVar24 = local_478 + 1;
        *local_478 = (byte)local_46c;
        local_608 = local_668;
        local_478 = pbVar24;
        plVar19 = RepeatedField<long>::data(pRVar17);
        stream_local = (EpsCopyOutputStream *)
                       protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                                 (stream,plVar19,uVar8,pbVar24);
        RepeatedField<long>::~RepeatedField
                  ((RepeatedField<long> *)((long)&r_11.soo_rep_.field_0 + 8));
        break;
      case TYPE_SINT32:
        pRVar15 = Reflection::GetRepeatedFieldInternal<int>(this,message,field);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)((long)&r_3.soo_rep_.field_0 + 8),pRVar15);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        local_320 = (RepeatedField<int> *)((long)&r_3.soo_rep_.field_0 + 8);
        local_324 = (uint)sVar18;
        it_4 = (const_pointer)protobuf::io::EpsCopyOutputStream::ZigZagEncode32;
        local_330 = (EpsCopyOutputStream *)puVar14;
        local_314 = iVar6;
        local_310 = stream;
        local_330 = (EpsCopyOutputStream *)
                    protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_2ec = local_314;
        local_2f0 = local_324;
        local_2a4 = local_314;
        local_2a8 = 2;
        local_2c9 = 0;
        local_2f8 = (byte *)local_330;
        local_2e8 = stream;
        local_2b0 = (byte *)local_330;
        local_2a0 = stream;
        if (stream->end_ <= local_330) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_2c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_2c9 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2c8);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_2b1,pLVar27);
        }
        if ((local_2c9 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_2c8);
        }
        local_298 = local_2b0;
        for (local_28c = local_2a4 << 3 | local_2a8; 0x7f < local_28c; local_28c = local_28c >> 7) {
          *local_298 = (byte)local_28c | 0x80;
          local_298 = local_298 + 1;
        }
        local_2f8 = local_298 + 1;
        *local_298 = (byte)local_28c;
        local_288 = (EpsCopyOutputStream *)local_2f8;
        for (local_27c = local_2f0; 0x7f < local_27c; local_27c = local_27c >> 7) {
          *(byte *)local_288 = (byte)local_27c | 0x80;
          local_288 = (EpsCopyOutputStream *)((long)local_288 + 1);
        }
        local_330 = (EpsCopyOutputStream *)((long)local_288 + 1);
        *(byte *)local_288 = (byte)local_27c;
        local_298 = local_2f8;
        local_288 = local_330;
        piVar16 = RepeatedField<int>::data(local_320);
        end_2 = piVar16;
        iVar6 = RepeatedField<int>::size(local_320);
        local_348 = piVar16 + iVar6;
        do {
          local_330 = (EpsCopyOutputStream *)
                      protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_330);
          iVar6 = *end_2;
          end_2 = end_2 + 1;
          local_2fc = (*(code *)it_4)(iVar6);
          local_308 = local_330;
          for (; 0x7f < local_2fc; local_2fc = local_2fc >> 7) {
            *(byte *)local_308 = (byte)local_2fc | 0x80;
            local_308 = (EpsCopyOutputStream *)((long)local_308 + 1);
          }
          stream_local = (EpsCopyOutputStream *)((long)local_308 + 1);
          *(byte *)local_308 = (byte)local_2fc;
          local_330 = stream_local;
          local_308 = stream_local;
        } while (end_2 < local_348);
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)((long)&r_3.soo_rep_.field_0 + 8));
        break;
      case MAX_TYPE:
        pRVar17 = Reflection::GetRepeatedFieldInternal<long>(this,message,field);
        RepeatedField<long>::RepeatedField
                  ((RepeatedField<long> *)((long)&r_4.soo_rep_.field_0 + 8),pRVar17);
        iVar6 = FieldDescriptor::number(field);
        sVar18 = FieldDataOnlyByteSize(field,message);
        local_250 = (RepeatedField<long> *)((long)&r_4.soo_rep_.field_0 + 8);
        local_254 = (uint)sVar18;
        it_5 = (const_pointer)protobuf::io::EpsCopyOutputStream::ZigZagEncode64;
        local_260 = (EpsCopyOutputStream *)puVar14;
        local_244 = iVar6;
        local_240 = stream;
        local_260 = (EpsCopyOutputStream *)
                    protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar14);
        local_21c = local_244;
        local_220 = local_254;
        local_1d4 = local_244;
        local_1d8 = 2;
        local_1f9 = 0;
        local_228 = (byte *)local_260;
        local_218 = stream;
        local_1e0 = (byte *)local_260;
        local_1d0 = stream;
        if (stream->end_ <= local_260) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                     ,0x355,"ptr < end_");
          local_1f9 = 1;
          pLVar27 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1f8);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_1e1,pLVar27);
        }
        if ((local_1f9 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_1f8);
        }
        local_1c8 = local_1e0;
        for (local_1bc = local_1d4 << 3 | local_1d8; 0x7f < local_1bc; local_1bc = local_1bc >> 7) {
          *local_1c8 = (byte)local_1bc | 0x80;
          local_1c8 = local_1c8 + 1;
        }
        local_228 = local_1c8 + 1;
        *local_1c8 = (byte)local_1bc;
        local_1b8 = (EpsCopyOutputStream *)local_228;
        for (local_1ac = local_220; 0x7f < local_1ac; local_1ac = local_1ac >> 7) {
          *(byte *)local_1b8 = (byte)local_1ac | 0x80;
          local_1b8 = (EpsCopyOutputStream *)((long)local_1b8 + 1);
        }
        local_260 = (EpsCopyOutputStream *)((long)local_1b8 + 1);
        *(byte *)local_1b8 = (byte)local_1ac;
        local_1c8 = local_228;
        local_1b8 = local_260;
        plVar19 = RepeatedField<long>::data(local_250);
        end_3 = plVar19;
        iVar6 = RepeatedField<long>::size(local_250);
        local_278 = plVar19 + iVar6;
        do {
          local_260 = (EpsCopyOutputStream *)
                      protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_260);
          lVar1 = *end_3;
          end_3 = end_3 + 1;
          local_230 = (*(code *)it_5)(lVar1);
          local_238 = local_260;
          for (; 0x7f < local_230; local_230 = local_230 >> 7) {
            *(byte *)local_238 = (byte)local_230 | 0x80;
            local_238 = (EpsCopyOutputStream *)((long)local_238 + 1);
          }
          stream_local = (EpsCopyOutputStream *)((long)local_238 + 1);
          *(byte *)local_238 = (byte)local_230;
          local_260 = stream_local;
          local_238 = stream_local;
        } while (end_3 < local_278);
        RepeatedField<long>::~RepeatedField
                  ((RepeatedField<long> *)((long)&r_4.soo_rep_.field_0 + 8));
      }
      field_local = (FieldDescriptor *)stream_local;
    }
  }
  else {
    get_message_from_field.message = (Message *)local_d70;
    _value = message;
    get_message_from_field.map_entries =
         (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          *)this;
    for (value_1._4_4_ = 0;
        value_1._4_4_ <
        map_entries.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; value_1._4_4_ = value_1._4_4_ + 1)
    {
      stream_local = (EpsCopyOutputStream *)
                     protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
      TVar5 = FieldDescriptor::type(field);
      switch(TVar5) {
      case TYPE_DOUBLE:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_1740 = Reflection::GetRepeatedDouble(this,message,field,value_1._4_4_);
        }
        else {
          local_1740 = Reflection::GetDouble(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteDoubleToArray(iVar6,local_1740,(uint8_t *)stream_local);
        break;
      case TYPE_FLOAT:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_1714 = Reflection::GetRepeatedFloat(this,message,field,value_1._4_4_);
        }
        else {
          local_1714 = Reflection::GetFloat(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFloatToArray(iVar6,local_1714,(uint8_t *)stream_local);
        break;
      case TYPE_INT64:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_15b0 = Reflection::GetRepeatedInt64(this,message,field,value_1._4_4_);
        }
        else {
          local_15b0 = Reflection::GetInt64(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteInt64ToArray(iVar6,local_15b0,(uint8_t *)stream_local);
        break;
      case TYPE_UINT64:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_1650 = Reflection::GetRepeatedUInt64(this,message,field,value_1._4_4_);
        }
        else {
          local_1650 = Reflection::GetUInt64(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteUInt64ToArray(iVar6,local_1650,(uint8_t *)stream_local);
        break;
      case TYPE_INT32:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_1584 = Reflection::GetRepeatedInt32(this,message,field,value_1._4_4_);
        }
        else {
          local_1584 = Reflection::GetInt32(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteInt32ToArray(iVar6,local_1584,(uint8_t *)stream_local);
        break;
      case TYPE_FIXED64:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_16a0 = Reflection::GetRepeatedUInt64(this,message,field,value_1._4_4_);
        }
        else {
          local_16a0 = Reflection::GetUInt64(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFixed64ToArray(iVar6,local_16a0,(uint8_t *)stream_local)
        ;
        break;
      case TYPE_FIXED32:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_1674 = Reflection::GetRepeatedUInt32(this,message,field,value_1._4_4_);
        }
        else {
          local_1674 = Reflection::GetUInt32(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteFixed32ToArray(iVar6,local_1674,(uint8_t *)stream_local)
        ;
        break;
      case TYPE_BOOL:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_175b = Reflection::GetRepeatedBool(this,message,field,value_1._4_4_);
        }
        else {
          local_175b = Reflection::GetBool(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteBoolToArray(iVar6,local_175b,(uint8_t *)stream_local);
        break;
      case TYPE_STRING:
        scratch.field_2._M_local_buf[0xf] = FieldDescriptor::requires_utf8_validation(field);
        std::__cxx11::string::string((string *)&value_14);
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_17e8 = Reflection::GetRepeatedStringReference
                                 (this,message,field,value_1._4_4_,(string *)&value_14);
        }
        else {
          local_17e8 = Reflection::GetStringReference(this,message,field,(string *)&value_14);
        }
        if ((scratch.field_2._M_local_buf[0xf] & 1U) == 0) {
          data_02 = (char *)std::__cxx11::string::data();
          iVar6 = std::__cxx11::string::length();
          sVar32 = FieldDescriptor::full_name(field);
          VerifyUTF8StringNamedField(data_02,iVar6,SERIALIZE,sVar32);
        }
        else {
          this_01 = (WireFormatLite *)std::__cxx11::string::data();
          uVar8 = std::__cxx11::string::length();
          sVar32 = FieldDescriptor::full_name(field);
          field_name._M_str = in_R9;
          field_name._M_len = (size_t)sVar32._M_str;
          WireFormatLite::VerifyUtf8String
                    (this_01,(char *)(ulong)uVar8,1,(Operation)sVar32._M_len,field_name);
        }
        uVar10 = FieldDescriptor::number(field);
        sVar29 = std::__cxx11::string::size();
        bVar3 = true;
        if ((long)sVar29 < 0x80) {
          puVar14 = stream->end_;
          iVar6 = protobuf::io::EpsCopyOutputStream::TagSize(uVar10 << 3);
          bVar3 = (long)(puVar14 + (-(long)iVar6 - (long)stream_local) + 0xf) < (long)sVar29;
        }
        if (bVar3) {
          sVar32 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_17e8);
          local_960 = (EpsCopyOutputStream *)
                      protobuf::io::EpsCopyOutputStream::WriteStringOutline
                                (stream,uVar10,sVar32,(uint8_t *)stream_local);
        }
        else {
          local_958 = stream_local;
          for (local_94c = uVar10 << 3 | 2; 0x7f < local_94c; local_94c = local_94c >> 7) {
            *(byte *)&local_958->end_ = (byte)local_94c | 0x80;
            local_958 = (EpsCopyOutputStream *)((long)&local_958->end_ + 1);
          }
          *(byte *)&local_958->end_ = (byte)local_94c;
          puVar14 = (uint8_t *)((long)&local_958->end_ + 2);
          *(uint8_t *)((long)&local_958->end_ + 1) = (uint8_t)sVar29;
          pvVar30 = (void *)std::__cxx11::string::data();
          memcpy(puVar14,pvVar30,sVar29);
          local_960 = (EpsCopyOutputStream *)(puVar14 + sVar29);
        }
        stream_local = local_960;
        std::__cxx11::string::~string((string *)&value_14);
        break;
      case TYPE_GROUP:
        pMVar28 = &InternalSerializeField::anon_class_24_3_10f69874::operator()
                             ((anon_class_24_3_10f69874 *)&value,field,value_1._4_4_)->
                   super_MessageLite;
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::InternalWriteGroup
                                 (iVar6,pMVar28,(uint8_t *)stream_local,stream);
        break;
      case TYPE_MESSAGE:
        pMVar28 = &InternalSerializeField::anon_class_24_3_10f69874::operator()
                             ((anon_class_24_3_10f69874 *)&value,field,value_1._4_4_)->
                   super_MessageLite;
        iVar6 = FieldDescriptor::number(field);
        iVar7 = protobuf::MessageLite::GetCachedSize(pMVar28);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::InternalWriteMessage
                                 (iVar6,pMVar28,iVar7,(uint8_t *)stream_local,stream);
        break;
      case TYPE_BYTES:
        CVar9 = FieldDescriptor::cpp_string_type(field);
        if (CVar9 == kCord) {
          Reflection::GetCord((Reflection *)((long)&scratch_1.field_2 + 8),(Message *)this,
                              (FieldDescriptor *)message);
          uVar10 = FieldDescriptor::number(field);
          stream_local = (EpsCopyOutputStream *)
                         protobuf::io::EpsCopyOutputStream::WriteString
                                   (stream,uVar10,(Cord *)((long)&scratch_1.field_2 + 8),
                                    (uint8_t *)stream_local);
          absl::lts_20250127::Cord::~Cord((Cord *)((long)&scratch_1.field_2 + 8));
        }
        else {
          std::__cxx11::string::string((string *)&value_15);
          bVar3 = FieldDescriptor::is_repeated(field);
          if (bVar3) {
            local_18a8 = Reflection::GetRepeatedStringReference
                                   (this,message,field,value_1._4_4_,(string *)&value_15);
          }
          else {
            local_18a8 = Reflection::GetStringReference(this,message,field,(string *)&value_15);
          }
          uVar10 = FieldDescriptor::number(field);
          sVar29 = std::__cxx11::string::size();
          bVar3 = true;
          if ((long)sVar29 < 0x80) {
            puVar14 = stream->end_;
            iVar6 = protobuf::io::EpsCopyOutputStream::TagSize(uVar10 << 3);
            bVar3 = (long)(puVar14 + (-(long)iVar6 - (long)stream_local) + 0xf) < (long)sVar29;
          }
          if (bVar3) {
            sVar32 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_18a8);
            local_9a0 = (EpsCopyOutputStream *)
                        protobuf::io::EpsCopyOutputStream::WriteStringOutline
                                  (stream,uVar10,sVar32,(uint8_t *)stream_local);
          }
          else {
            local_948 = stream_local;
            for (local_93c = uVar10 << 3 | 2; 0x7f < local_93c; local_93c = local_93c >> 7) {
              *(byte *)&local_948->end_ = (byte)local_93c | 0x80;
              local_948 = (EpsCopyOutputStream *)((long)&local_948->end_ + 1);
            }
            *(byte *)&local_948->end_ = (byte)local_93c;
            puVar14 = (uint8_t *)((long)&local_948->end_ + 2);
            *(uint8_t *)((long)&local_948->end_ + 1) = (uint8_t)sVar29;
            pvVar30 = (void *)std::__cxx11::string::data();
            memcpy(puVar14,pvVar30,sVar29);
            local_9a0 = (EpsCopyOutputStream *)(puVar14 + sVar29);
          }
          stream_local = local_9a0;
          std::__cxx11::string::~string((string *)&value_15);
        }
        break;
      case TYPE_UINT32:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_1624 = Reflection::GetRepeatedUInt32(this,message,field,value_1._4_4_);
        }
        else {
          local_1624 = Reflection::GetUInt32(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteUInt32ToArray(iVar6,local_1624,(uint8_t *)stream_local);
        break;
      case TYPE_ENUM:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_17b8 = Reflection::GetRepeatedEnum(this,message,field,value_1._4_4_);
        }
        else {
          local_17b8 = Reflection::GetEnum(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        iVar7 = EnumValueDescriptor::number(local_17b8);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteEnumToArray(iVar6,iVar7,(uint8_t *)stream_local);
        break;
      case TYPE_SFIXED32:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_16c4 = Reflection::GetRepeatedInt32(this,message,field,value_1._4_4_);
        }
        else {
          local_16c4 = Reflection::GetInt32(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSFixed32ToArray
                                 (iVar6,local_16c4,(uint8_t *)stream_local);
        break;
      case TYPE_SFIXED64:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_16f0 = Reflection::GetRepeatedInt64(this,message,field,value_1._4_4_);
        }
        else {
          local_16f0 = Reflection::GetInt64(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSFixed64ToArray
                                 (iVar6,local_16f0,(uint8_t *)stream_local);
        break;
      case TYPE_SINT32:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_15d4 = Reflection::GetRepeatedInt32(this,message,field,value_1._4_4_);
        }
        else {
          local_15d4 = Reflection::GetInt32(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSInt32ToArray(iVar6,local_15d4,(uint8_t *)stream_local);
        break;
      case MAX_TYPE:
        bVar3 = FieldDescriptor::is_repeated(field);
        if (bVar3) {
          local_1600 = Reflection::GetRepeatedInt64(this,message,field,value_1._4_4_);
        }
        else {
          local_1600 = Reflection::GetInt64(this,message,field);
        }
        iVar6 = FieldDescriptor::number(field);
        stream_local = (EpsCopyOutputStream *)
                       WireFormatLite::WriteSInt64ToArray(iVar6,local_1600,(uint8_t *)stream_local);
      }
    }
    field_local = (FieldDescriptor *)stream_local;
  }
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             *)local_d70);
  return (uint8_t *)field_local;
}

Assistant:

uint8_t* WireFormat::InternalSerializeField(const FieldDescriptor* field,
                                            const Message& message,
                                            uint8_t* target,
                                            io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return InternalSerializeMessageSetItem(field, message, target, stream);
  }


  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      if (stream->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueConstRef map_value;
          message_reflection->LookupMapValue(message, field, *it, &map_value);
          target =
              InternalSerializeMapEntry(field, *it, map_value, target, stream);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          target = InternalSerializeMapEntry(field, it.GetKey(),
                                             it.GetValueRef(), target, stream);
        }
      }

      return target;
    }
  }
  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && stream->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  if (field->is_packed()) {
    if (count == 0) return target;
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->Write##TYPE_METHOD##Packed(                               \
        field->number(), r, FieldDataOnlyByteSize(field, message), target);    \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)
      HANDLE_PRIMITIVE_TYPE(ENUM, int, Enum, Enum)

#undef HANDLE_PRIMITIVE_TYPE
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->WriteFixedPacked(field->number(), r, target);             \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE
      default:
        ABSL_LOG(FATAL) << "Invalid descriptor";
    }
    return target;
  }

  auto get_message_from_field = [&message, &map_entries, message_reflection](
                                    const FieldDescriptor* field, int j) {
    if (!field->is_repeated()) {
      return &message_reflection->GetMessage(message, field);
    }
    if (!map_entries.empty()) {
      return map_entries[j];
    }
    return &message_reflection->GetRepeatedMessage(message, field, j);
  };
  for (int j = 0; j < count; j++) {
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)     \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    const CPPTYPE value =                                                     \
        field->is_repeated()                                                  \
            ? message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                              j)              \
            : message_reflection->Get##CPPTYPE_METHOD(message, field);        \
    target = WireFormatLite::Write##TYPE_METHOD##ToArray(field->number(),     \
                                                         value, target);      \
    break;                                                                    \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

      case FieldDescriptor::TYPE_GROUP: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteGroup(field->number(), *msg,
                                                    target, stream);
      } break;

      case FieldDescriptor::TYPE_MESSAGE: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteMessage(
            field->number(), *msg, msg->GetCachedSize(), target, stream);
      } break;

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value =
            field->is_repeated()
                ? message_reflection->GetRepeatedEnum(message, field, j)
                : message_reflection->GetEnum(message, field);
        target = WireFormatLite::WriteEnumToArray(field->number(),
                                                  value->number(), target);
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = field->requires_utf8_validation();
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name());
        }
        target = stream->WriteString(field->number(), value, target);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          absl::Cord value = message_reflection->GetCord(message, field);
          target = stream->WriteString(field->number(), value, target);
          break;
        }
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        target = stream->WriteString(field->number(), value, target);
        break;
      }
    }
  }
  return target;
}